

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O0

void __thiscall CVmHandleManager::CVmHandleManager(CVmHandleManager *this)

{
  void *pvVar1;
  undefined8 *in_RDI;
  size_t i;
  ulong local_10;
  
  *in_RDI = &PTR__CVmHandleManager_003e20f0;
  in_RDI[2] = 0x20;
  pvVar1 = malloc(in_RDI[2] << 3);
  in_RDI[1] = pvVar1;
  for (local_10 = 0; local_10 < (ulong)in_RDI[2]; local_10 = local_10 + 1) {
    *(undefined8 *)(in_RDI[1] + local_10 * 8) = 0;
  }
  return;
}

Assistant:

CVmHandleManager::CVmHandleManager()
{
    size_t i;

    /* allocate an initial array of handle slots */
    handles_max_ = 32;
    handles_ = (void **)t3malloc(handles_max_ * sizeof(*handles_));

    /* all slots are initially empty */
    for (i = 0 ; i < handles_max_ ; ++i)
        handles_[i] = 0;
}